

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_impl
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  GenericFeatureChain *src_extended_features_chain;
  _Alloc_hider _Var1;
  PhysicalDevice *pPVar2;
  pointer ppVVar3;
  size_type sVar4;
  VkResult VVar5;
  pointer pGVar6;
  _Alloc_hider _Var7;
  long lVar8;
  pointer ppVVar9;
  long lVar10;
  PhysicalDevice *physical_device_1;
  __normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
  __seed;
  initializer_list<vkb::PhysicalDevice> __l;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> vk_physical_devices;
  PhysicalDevice physical_device;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> physical_devices;
  allocator_type local_df9;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_df8;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *local_de0;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> local_dd8;
  PhysicalDevice local_db8;
  PhysicalDevice local_6f8;
  
  for (pGVar6 = (this->criteria).extended_features_chain.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar6 != (this->criteria).extended_features_chain.nodes.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar6 = pGVar6 + 1) {
    if (pGVar6->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
      __assert_fail("node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 && \"Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An \" \"instance of this is managed internally for selection criteria and device creation.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                    ,0x4e1,
                    "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
                   );
    }
    if (pGVar6->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
      __assert_fail("node.sType != static_cast<VkStructureType>(0) && \"Features struct sType must be filled with the struct\'s \" \"corresponding VkStructureType enum\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                    ,0x4de,
                    "Result<std::vector<PhysicalDevice>> vkb::PhysicalDeviceSelector::select_impl() const"
                   );
    }
  }
  if ((((this->criteria).require_present != false) &&
      ((this->criteria).defer_surface_initialization == false)) &&
     ((this->instance_info).surface == (VkSurfaceKHR)0x0)) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
    return __return_storage_ptr__;
  }
  local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar5 = detail::
          get_vector<VkPhysicalDevice_T*,VkResult(*&)(VkInstance_T*,unsigned_int*,VkPhysicalDevice_T**),VkInstance_T*const&>
                    (&local_df8,
                     (_func_VkResult_VkInstance_T_ptr_uint_ptr_VkPhysicalDevice_T_ptr_ptr **)
                     (detail::vulkan_functions()::v + 0x78),(VkInstance_T **)this);
  ppVVar3 = local_df8.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (VVar5 == VK_SUCCESS) {
    if (local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      src_extended_features_chain = &(this->criteria).extended_features_chain;
      if ((this->criteria).use_first_gpu_unconditionally == true) {
        populate_device_details
                  (&local_db8,this,
                   *local_df8.
                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,src_extended_features_chain);
        select_impl::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,&local_db8)
        ;
        PhysicalDevice::PhysicalDevice(&local_6f8,&local_db8);
        __l._M_len = 1;
        __l._M_array = &local_6f8;
        std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                  (&local_dd8,__l,&local_df9);
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_dd8.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __return_storage_ptr__->m_init = true;
        std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector(&local_dd8);
        if (local_6f8.extended_features_chain.nodes.
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f8.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_6f8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_6f8.queue_families.
            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f8.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_6f8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_6f8.available_extensions);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_6f8.extensions_to_enable);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8.name._M_dataplus._M_p != &local_6f8.name.field_2) {
          operator_delete(local_6f8.name._M_dataplus._M_p,
                          local_6f8.name.field_2._M_allocated_capacity + 1);
        }
        if (local_db8.extended_features_chain.nodes.
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_db8.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_db8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_db8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_db8.queue_families.
            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_db8.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_db8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_db8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_db8.available_extensions);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_db8.extensions_to_enable);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_db8.name._M_dataplus._M_p != &local_db8.name.field_2) {
          operator_delete(local_db8.name._M_dataplus._M_p,
                          local_db8.name.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001068c2;
      }
      local_6f8.name._M_dataplus._M_p = (pointer)0x0;
      local_6f8.name._M_string_length = 0;
      local_6f8.name.field_2._M_allocated_capacity = 0;
      ppVVar9 = local_df8.
                super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_de0 = __return_storage_ptr__;
      do {
        populate_device_details(&local_db8,this,*ppVVar9,src_extended_features_chain);
        local_db8.suitable = is_device_suitable(this,&local_db8);
        if (local_db8.suitable != no) {
          std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::push_back
                    ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)&local_6f8
                     ,&local_db8);
        }
        if (local_db8.extended_features_chain.nodes.
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_db8.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_db8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_db8.extended_features_chain.nodes.
                                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_db8.queue_families.
            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_db8.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_db8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_db8.queue_families.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_db8.available_extensions);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_db8.extensions_to_enable);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_db8.name._M_dataplus._M_p != &local_db8.name.field_2) {
          operator_delete(local_db8.name._M_dataplus._M_p,
                          local_db8.name.field_2._M_allocated_capacity + 1);
        }
        sVar4 = local_6f8.name._M_string_length;
        ppVVar9 = ppVVar9 + 1;
      } while (ppVVar9 != ppVVar3);
      lVar10 = local_6f8.name._M_string_length - (long)local_6f8.name._M_dataplus._M_p;
      lVar8 = (lVar10 >> 6) * -0x7b425ed097b425ed >> 2;
      _Var7._M_p = local_6f8.name._M_dataplus._M_p;
      __return_storage_ptr__ = local_de0;
      _Var1._M_p = local_6f8.name._M_dataplus._M_p;
      pPVar2 = (PhysicalDevice *)local_6f8.name._M_string_length;
      if (0 < lVar8) {
        _Var7._M_p = local_6f8.name._M_dataplus._M_p + lVar8 * 0x1b00;
        lVar8 = lVar8 + 1;
        __seed._M_current = (PhysicalDevice *)(local_6f8.name._M_dataplus._M_p + 0xd80);
        do {
          if (__seed._M_current[-2].suitable != yes) {
            __seed._M_current = __seed._M_current + -2;
            goto LAB_00106c80;
          }
          if (__seed._M_current[-1].suitable != yes) {
            __seed._M_current = __seed._M_current + -1;
            goto LAB_00106c80;
          }
          if ((__seed._M_current)->suitable != yes) goto LAB_00106c80;
          if (__seed._M_current[1].suitable != yes) {
            __seed._M_current = __seed._M_current + 1;
            goto LAB_00106c80;
          }
          lVar8 = lVar8 + -1;
          __seed._M_current = __seed._M_current + 4;
        } while (1 < lVar8);
        lVar10 = local_6f8.name._M_string_length - (long)_Var7._M_p;
      }
      lVar8 = (lVar10 >> 6) * -0x7b425ed097b425ed;
      if (lVar8 == 1) {
LAB_00106c57:
        __seed._M_current = (PhysicalDevice *)_Var7._M_p;
        if (((PhysicalDevice *)_Var7._M_p)->suitable == yes) {
          __seed._M_current = (PhysicalDevice *)local_6f8.name._M_string_length;
        }
LAB_00106c80:
        if (__seed._M_current != (PhysicalDevice *)local_6f8.name._M_string_length) {
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
                               *)&local_db8,__seed,
                              ((long)(local_6f8.name._M_string_length - (long)__seed._M_current) >>
                              6) * -0x7b425ed097b425ed);
          std::
          __stable_partition_adaptive<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice*,std::vector<vkb::PhysicalDevice,std::allocator<vkb::PhysicalDevice>>>,vkb::PhysicalDevice*,__gnu_cxx::__ops::_Iter_pred<vkb::PhysicalDeviceSelector::select_impl()const::__1>,long>
                    (__seed._M_current,sVar4,local_db8.name._M_dataplus._M_p,
                     local_db8.name.field_2._M_allocated_capacity,local_db8.name._M_string_length);
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>,_vkb::PhysicalDevice>
                      *)&local_db8);
          __return_storage_ptr__ = local_de0;
          _Var1._M_p = local_6f8.name._M_dataplus._M_p;
          pPVar2 = (PhysicalDevice *)local_6f8.name._M_string_length;
        }
      }
      else {
        if (lVar8 == 2) {
LAB_00106c47:
          __seed._M_current = (PhysicalDevice *)_Var7._M_p;
          if (((PhysicalDevice *)_Var7._M_p)->suitable == yes) {
            _Var7._M_p = _Var7._M_p + 0x6c0;
            goto LAB_00106c57;
          }
          goto LAB_00106c80;
        }
        if (lVar8 == 3) {
          __seed._M_current = (PhysicalDevice *)_Var7._M_p;
          if (((PhysicalDevice *)_Var7._M_p)->suitable == yes) {
            _Var7._M_p = _Var7._M_p + 0x6c0;
            goto LAB_00106c47;
          }
          goto LAB_00106c80;
        }
      }
      for (; sVar4 = local_6f8.name._M_string_length, local_de0 = __return_storage_ptr__,
          _Var1._M_p != (pointer)local_6f8.name._M_string_length;
          _Var1._M_p = (pointer)((long)_Var1._M_p + 0x6c0)) {
        local_6f8.name._M_string_length = (size_type)pPVar2;
        select_impl::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)this,(PhysicalDevice *)_Var1._M_p);
        __return_storage_ptr__ = local_de0;
        pPVar2 = (PhysicalDevice *)local_6f8.name._M_string_length;
        local_6f8.name._M_string_length = sVar4;
      }
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_6f8.name._M_dataplus._M_p;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar2;
      (__return_storage_ptr__->field_0).m_value.
      super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_6f8.name.field_2._M_allocated_capacity;
      local_6f8.name._M_dataplus._M_p = (pointer)0x0;
      local_6f8.name._M_string_length = 0;
      local_6f8.name.field_2._M_allocated_capacity = 0;
      __return_storage_ptr__->m_init = true;
      std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
                ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)&local_6f8);
      goto LAB_001068c2;
    }
    (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VVar5;
  }
  __return_storage_ptr__->m_init = false;
LAB_001068c2:
  if (local_df8.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_df8.
                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_df8.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_df8.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_impl() const {
#if !defined(NDEBUG)
    // Validation
    for (const auto& node : criteria.extended_features_chain.nodes) {
        assert(node.sType != static_cast<VkStructureType>(0) &&
               "Features struct sType must be filled with the struct's "
               "corresponding VkStructureType enum");
        assert(node.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 &&
               "Do not pass VkPhysicalDeviceFeatures2 as a required extension feature structure. An "
               "instance of this is managed internally for selection criteria and device creation.");
    }
#endif

    if (criteria.require_present && !criteria.defer_surface_initialization) {
        if (instance_info.surface == VK_NULL_HANDLE)
            return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_surface_provided };
    }

    // Get the VkPhysicalDevice handles on the system
    std::vector<VkPhysicalDevice> vk_physical_devices;

    auto vk_physical_devices_ret = detail::get_vector<VkPhysicalDevice>(
        vk_physical_devices, detail::vulkan_functions().fp_vkEnumeratePhysicalDevices, instance_info.instance);
    if (vk_physical_devices_ret != VK_SUCCESS) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::failed_enumerate_physical_devices, vk_physical_devices_ret };
    }
    if (vk_physical_devices.size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_physical_devices_found };
    }

    auto fill_out_phys_dev_with_criteria = [&](PhysicalDevice& phys_dev) {
        phys_dev.features = criteria.required_features;
        phys_dev.extended_features_chain = criteria.extended_features_chain;
        bool portability_ext_available = false;
        for (const auto& ext : phys_dev.available_extensions)
            if (criteria.enable_portability_subset && ext == "VK_KHR_portability_subset")
                portability_ext_available = true;


        phys_dev.extensions_to_enable.clear();
        phys_dev.extensions_to_enable.insert(
            phys_dev.extensions_to_enable.end(), criteria.required_extensions.begin(), criteria.required_extensions.end());
        if (portability_ext_available) {
            phys_dev.extensions_to_enable.push_back("VK_KHR_portability_subset");
        }
    };

    // if this option is set, always return only the first physical device found
    if (criteria.use_first_gpu_unconditionally && vk_physical_devices.size() > 0) {
        PhysicalDevice physical_device = populate_device_details(vk_physical_devices[0], criteria.extended_features_chain);
        fill_out_phys_dev_with_criteria(physical_device);
        return std::vector<PhysicalDevice>{ physical_device };
    }

    // Populate their details and check their suitability
    std::vector<PhysicalDevice> physical_devices;
    for (auto& vk_physical_device : vk_physical_devices) {
        PhysicalDevice phys_dev = populate_device_details(vk_physical_device, criteria.extended_features_chain);
        phys_dev.suitable = is_device_suitable(phys_dev);
        if (phys_dev.suitable != PhysicalDevice::Suitable::no) {
            physical_devices.push_back(phys_dev);
        }
    }

    // sort the list into fully and partially suitable devices. use stable_partition to maintain relative order
    std::stable_partition(physical_devices.begin(), physical_devices.end(), [](auto const& pd) {
        return pd.suitable == PhysicalDevice::Suitable::yes;
    });

    // Make the physical device ready to be used to create a Device from it
    for (auto& physical_device : physical_devices) {
        fill_out_phys_dev_with_criteria(physical_device);
    }

    return physical_devices;
}